

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O0

pair<std::shared_ptr<hwnet::Buffer>,_int> * __thiscall
Codecc::Decode(pair<std::shared_ptr<hwnet::Buffer>,_int> *__return_storage_ptr__,Codecc *this)

{
  size_t sVar1;
  undefined1 *puVar2;
  element_type *peVar3;
  char *pcVar4;
  int local_68 [2];
  pair<std::nullptr_t,_int> local_60;
  int local_50 [4];
  undefined1 local_40 [8];
  Ptr b;
  size_t len;
  char *ptr;
  size_t size;
  Codecc *this_local;
  
  puVar2 = (undefined1 *)(this->w - this->r);
  if ((undefined1 *)0x4 < puVar2) {
    peVar3 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar4 = hwnet::Buffer::BuffPtr(peVar3);
    sVar1 = this->r;
    b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)*(int *)(pcVar4 + sVar1);
    if ((undefined1 *)
        ((long)&(b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_vptr__Sp_counted_base + 4U) <= puVar2) {
      hwnet::Buffer::New((size_t)local_40,
                         (size_t)((long)&(b.
                                          super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4));
      peVar3 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      hwnet::Buffer::Append
                (peVar3,pcVar4 + sVar1,
                 (size_t)((long)&(b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 4));
      this->r = (long)&(b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_vptr__Sp_counted_base + this->r + 4;
      local_50[0] = 0;
      std::make_pair<std::shared_ptr<hwnet::Buffer>&,int>
                (__return_storage_ptr__,(shared_ptr<hwnet::Buffer> *)local_40,local_50);
      std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)local_40);
      return __return_storage_ptr__;
    }
  }
  local_68[0] = 0;
  local_68[1] = 0;
  std::make_pair<decltype(nullptr),int>(&local_60.first,local_68);
  std::pair<std::shared_ptr<hwnet::Buffer>,_int>::pair<std::nullptr_t,_int,_true>
            (__return_storage_ptr__,&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Buffer::Ptr,int> Decode() {
		size_t size = this->w - this->r;
		//std::cout << "decode " << this->w << "," << this->r << std::endl; 
		if(size > 4) {
			char *ptr = this->buffer->BuffPtr() + this->r;
			size_t len = (size_t)*(int*)&ptr[0];//包体大小
			if(size >= len+4) {
				Buffer::Ptr b = Buffer::New(len+4);
				b->Append(ptr,len+4);

				//int len = *(int*)&b->BuffPtr()[0];
				//int no = *(int*)&b->BuffPtr()[4];
				//std::cout << len << "," << no << "," << Buffer::New(b,8,b->Len())->ToString()  << std::endl;

				this->r += (len+4);
				return std::make_pair(b,0);
			}
		}
		return std::make_pair(nullptr,0);
	}